

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_initFastDStream(BYTE *ip)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  
  bVar1 = ip[7];
  iVar2 = 0x1f;
  if (bVar1 != 0) {
    for (; bVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  bVar3 = ~(byte)iVar2 + 9;
  if (bVar1 == 0) {
    bVar3 = 0;
  }
  return (*(ulong *)ip | 1) << (bVar3 & 0x3f);
}

Assistant:

static size_t HUF_initFastDStream(BYTE const* ip) {
    BYTE const lastByte = ip[7];
    size_t const bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
    size_t const value = MEM_readLEST(ip) | 1;
    assert(bitsConsumed <= 8);
    assert(sizeof(size_t) == 8);
    return value << bitsConsumed;
}